

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void State_init(void)

{
  s_x3node *psVar1;
  int local_c;
  int i;
  
  if ((x3a == (s_x3 *)0x0) && (x3a = (s_x3 *)malloc(0x18), x3a != (s_x3 *)0x0)) {
    x3a->size = 0x80;
    x3a->count = 0;
    psVar1 = (s_x3node *)calloc(0x80,0x28);
    x3a->tbl = psVar1;
    if (x3a->tbl == (s_x3node *)0x0) {
      free(x3a);
      x3a = (s_x3 *)0x0;
    }
    else {
      x3a->ht = (s_x3node **)(x3a->tbl + 0x80);
      for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
        x3a->ht[local_c] = (s_x3node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void State_init(){
  if( x3a ) return;
  x3a = (struct s_x3*)malloc( sizeof(struct s_x3) );
  if( x3a ){
    x3a->size = 128;
    x3a->count = 0;
    x3a->tbl = (x3node*)calloc(128, sizeof(x3node) + sizeof(x3node*));
    if( x3a->tbl==0 ){
      free(x3a);
      x3a = 0;
    }else{
      int i;
      x3a->ht = (x3node**)&(x3a->tbl[128]);
      for(i=0; i<128; i++) x3a->ht[i] = 0;
    }
  }
}